

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_exif.cc
# Opt level: O0

anon_unknown_0 * __thiscall
core::image::anon_unknown_0::debug_print<int>(anon_unknown_0 *this,int *value,string *extra)

{
  string local_58 [55];
  allocator local_21;
  string *local_20;
  string *extra_local;
  int *value_local;
  
  local_20 = extra;
  extra_local = (string *)value;
  value_local = (int *)this;
  if (*value < 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"<not set>",&local_21);
    std::allocator<char>::~allocator((allocator<char> *)&local_21);
  }
  else {
    util::string::get<int>(local_58,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
    std::__cxx11::string::~string((string *)local_58);
  }
  return this;
}

Assistant:

std::string
    debug_print (T const& value, std::string extra = "")
    {
        if (value < T(0))
            return "<not set>";
        else
            return util::string::get(value) + extra;
    }